

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

bool covenant::intersect_unorder_ord<covenant::Sym>
               (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *unord_s,
               vector<covenant::Sym,_std::allocator<covenant::Sym>_> *ord_s)

{
  __normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
  __last;
  bool bVar1;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *this;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *pvVar2;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_RDI;
  __normal_iterator<covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
  unaff_retaddr;
  uint i;
  uint local_1c;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *__val;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_1c = 0;
  __val = in_RDI;
  while( true ) {
    this = (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)(ulong)local_1c;
    pvVar2 = (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
             std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size(in_RDI);
    if (pvVar2 <= this) {
      return false;
    }
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::begin(this);
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::end(this);
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[](in_RDI,(ulong)local_1c);
    __last._M_current._7_1_ = in_stack_ffffffffffffffff;
    __last._M_current._0_7_ = in_stack_fffffffffffffff8;
    bVar1 = std::
            binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                      (unaff_retaddr,__last,(Sym *)__val);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool intersect_unorder_ord(vector<T> unord_s, vector<T> ord_s){
    for (unsigned i=0; i < unord_s.size(); i++){
      if (binary_search(ord_s.begin(), ord_s.end(), unord_s[i]))
	return true;
    }
    return false;
  }